

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-million-timers.c
# Opt level: O3

int run_benchmark_million_timers(void)

{
  int iVar1;
  int extraout_EAX;
  void *__ptr;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  long lVar7;
  ulong timeout;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  __ptr = malloc(1520000000);
  if (__ptr == (void *)0x0) {
LAB_0010b572:
    run_benchmark_million_timers_cold_8();
LAB_0010b577:
    run_benchmark_million_timers_cold_3();
LAB_0010b57c:
    run_benchmark_million_timers_cold_4();
LAB_0010b581:
    run_benchmark_million_timers_cold_5();
  }
  else {
    puVar2 = uv_default_loop();
    lVar7 = 0;
    uVar3 = uv_hrtime();
    uVar9 = 0;
    iVar8 = 0;
    timeout = 0;
    do {
      iVar1 = uv_timer_init(puVar2,(uv_timer_t *)((long)__ptr + lVar7));
      if (iVar1 != 0) {
LAB_0010b56d:
        run_benchmark_million_timers_cold_1();
        goto LAB_0010b572;
      }
      timeout = (ulong)((int)timeout + (uint)((int)(uVar9 / 1000) * 1000 + iVar8 == 0));
      iVar1 = uv_timer_start((uv_timer_t *)((long)__ptr + lVar7),timer_cb,timeout,0);
      if (iVar1 != 0) {
        run_benchmark_million_timers_cold_2();
        goto LAB_0010b56d;
      }
      iVar8 = iVar8 + -1;
      uVar9 = (ulong)((int)uVar9 + 1);
      lVar7 = lVar7 + 0x98;
    } while (lVar7 != 1520000000);
    uVar4 = uv_hrtime();
    iVar8 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar8 != 0) goto LAB_0010b577;
    lVar7 = 0;
    uVar5 = uv_hrtime();
    do {
      uv_close((uv_handle_t *)((long)__ptr + lVar7),close_cb);
      lVar7 = lVar7 + 0x98;
    } while (lVar7 != 1520000000);
    iVar8 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar8 != 0) goto LAB_0010b57c;
    uVar6 = uv_hrtime();
    if (timer_cb_called != 10000000) goto LAB_0010b581;
    if (close_cb_called == 10000000) {
      free(__ptr);
      lVar7 = uVar6 - uVar3;
      auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar10._0_8_ = lVar7;
      auVar10._12_4_ = 0x45300000;
      fprintf(_stderr,"%.2f seconds total\n",
              ((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / 1000000000.0);
      lVar7 = uVar4 - uVar3;
      auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = 0x45300000;
      fprintf(_stderr,"%.2f seconds init\n",
              ((auVar11._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / 1000000000.0);
      lVar7 = uVar5 - uVar4;
      auVar12._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar12._0_8_ = lVar7;
      auVar12._12_4_ = 0x45300000;
      fprintf(_stderr,"%.2f seconds dispatch\n",
              ((auVar12._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / 1000000000.0);
      lVar7 = uVar6 - uVar5;
      auVar13._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar13._0_8_ = lVar7;
      auVar13._12_4_ = 0x45300000;
      fprintf(_stderr,"%.2f seconds cleanup\n",
              ((auVar13._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / 1000000000.0);
      fflush(_stderr);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar8 = uv_loop_close(puVar2);
      if (iVar8 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0010b58b;
    }
  }
  run_benchmark_million_timers_cold_6();
LAB_0010b58b:
  run_benchmark_million_timers_cold_7();
  timer_cb_called = timer_cb_called + 1;
  return extraout_EAX;
}

Assistant:

BENCHMARK_IMPL(million_timers) {
  uv_timer_t* timers;
  uv_loop_t* loop;
  uint64_t before_all;
  uint64_t before_run;
  uint64_t after_run;
  uint64_t after_all;
  int timeout;
  int i;

  timers = malloc(NUM_TIMERS * sizeof(timers[0]));
  ASSERT_NOT_NULL(timers);

  loop = uv_default_loop();
  timeout = 0;

  before_all = uv_hrtime();
  for (i = 0; i < NUM_TIMERS; i++) {
    if (i % 1000 == 0) timeout++;
    ASSERT(0 == uv_timer_init(loop, timers + i));
    ASSERT(0 == uv_timer_start(timers + i, timer_cb, timeout, 0));
  }

  before_run = uv_hrtime();
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  after_run = uv_hrtime();

  for (i = 0; i < NUM_TIMERS; i++)
    uv_close((uv_handle_t*) (timers + i), close_cb);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  after_all = uv_hrtime();

  ASSERT(timer_cb_called == NUM_TIMERS);
  ASSERT(close_cb_called == NUM_TIMERS);
  free(timers);

  fprintf(stderr, "%.2f seconds total\n", (after_all - before_all) / 1e9);
  fprintf(stderr, "%.2f seconds init\n", (before_run - before_all) / 1e9);
  fprintf(stderr, "%.2f seconds dispatch\n", (after_run - before_run) / 1e9);
  fprintf(stderr, "%.2f seconds cleanup\n", (after_all - after_run) / 1e9);
  fflush(stderr);

  MAKE_VALGRIND_HAPPY();
  return 0;
}